

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

int ShFinalize(void)

{
  TSymbolTable *pTVar1;
  TPoolAllocator *pTVar2;
  int local_44;
  int local_40;
  int pc;
  int source_1;
  int p_1;
  int spvVersion_1;
  int version_1;
  int stage;
  int source;
  int p;
  int spvVersion;
  int version;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&version,(mutex_type *)(anonymous_namespace)::init_lock);
  (anonymous_namespace)::NumberOfClients = (anonymous_namespace)::NumberOfClients + -1;
  if ((anonymous_namespace)::NumberOfClients < 0) {
    __assert_fail("NumberOfClients >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ShaderLang.cpp"
                  ,0x574,"int ShFinalize()");
  }
  if ((anonymous_namespace)::NumberOfClients < 1) {
    for (p = 0; p < 0x11; p = p + 1) {
      for (source = 0; source < 4; source = source + 1) {
        for (stage = 0; stage < 4; stage = stage + 1) {
          for (version_1 = 0; version_1 < 2; version_1 = version_1 + 1) {
            for (spvVersion_1 = 0; spvVersion_1 < 0xe; spvVersion_1 = spvVersion_1 + 1) {
              pTVar1 = *(TSymbolTable **)
                        ((anonymous_namespace)::SharedSymbolTables +
                        (long)spvVersion_1 * 8 +
                        (long)version_1 * 0x70 +
                        (long)stage * 0xe0 + (long)source * 0x380 + (long)p * 0xe00);
              if (pTVar1 != (TSymbolTable *)0x0) {
                glslang::TSymbolTable::~TSymbolTable(pTVar1);
                operator_delete(pTVar1,0x28);
              }
              *(undefined8 *)
               ((anonymous_namespace)::SharedSymbolTables +
               (long)spvVersion_1 * 8 +
               (long)version_1 * 0x70 + (long)stage * 0xe0 + (long)source * 0x380 + (long)p * 0xe00)
                   = 0;
            }
          }
        }
      }
    }
    for (p_1 = 0; pTVar2 = (anonymous_namespace)::PerProcessGPA, p_1 < 0x11; p_1 = p_1 + 1) {
      for (source_1 = 0; source_1 < 4; source_1 = source_1 + 1) {
        for (pc = 0; pc < 4; pc = pc + 1) {
          for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
            for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
              pTVar1 = *(TSymbolTable **)
                        ((anonymous_namespace)::CommonSymbolTable +
                        (long)local_44 * 8 +
                        (long)local_40 * 0x10 +
                        (long)pc * 0x20 + (long)source_1 * 0x80 + (long)p_1 * 0x200);
              if (pTVar1 != (TSymbolTable *)0x0) {
                glslang::TSymbolTable::~TSymbolTable(pTVar1);
                operator_delete(pTVar1,0x28);
              }
              *(undefined8 *)
               ((anonymous_namespace)::CommonSymbolTable +
               (long)local_44 * 8 +
               (long)local_40 * 0x10 + (long)pc * 0x20 + (long)source_1 * 0x80 + (long)p_1 * 0x200)
                   = 0;
            }
          }
        }
      }
    }
    if ((anonymous_namespace)::PerProcessGPA != (TPoolAllocator *)0x0) {
      if ((anonymous_namespace)::PerProcessGPA != (TPoolAllocator *)0x0) {
        glslang::TPoolAllocator::~TPoolAllocator((anonymous_namespace)::PerProcessGPA);
        operator_delete(pTVar2,0x60);
      }
      (anonymous_namespace)::PerProcessGPA = (TPoolAllocator *)0x0;
    }
  }
  lock._M_device._4_4_ = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&version);
  return lock._M_device._4_4_;
}

Assistant:

int ShFinalize()
{
#ifndef DISABLE_THREAD_SUPPORT
    const std::lock_guard<std::mutex> lock(init_lock);
#endif
    --NumberOfClients;
    assert(NumberOfClients >= 0);
    if (NumberOfClients > 0)
        return 1;

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int stage = 0; stage < EShLangCount; ++stage) {
                        delete SharedSymbolTables[version][spvVersion][p][source][stage];
                        SharedSymbolTables[version][spvVersion][p][source][stage] = nullptr;
                    }
                }
            }
        }
    }

    for (int version = 0; version < VersionCount; ++version) {
        for (int spvVersion = 0; spvVersion < SpvVersionCount; ++spvVersion) {
            for (int p = 0; p < ProfileCount; ++p) {
                for (int source = 0; source < SourceCount; ++source) {
                    for (int pc = 0; pc < EPcCount; ++pc) {
                        delete CommonSymbolTable[version][spvVersion][p][source][pc];
                        CommonSymbolTable[version][spvVersion][p][source][pc] = nullptr;
                    }
                }
            }
        }
    }

    if (PerProcessGPA != nullptr) {
        delete PerProcessGPA;
        PerProcessGPA = nullptr;
    }

    return 1;
}